

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack4.h
# Opt level: O0

void ncnn::convdw3x3s2_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  __m128 _r22_2;
  __m128 _r21_2;
  __m128 _r20_2;
  __m128 _r12_2;
  __m128 _r11_2;
  __m128 _r10_2;
  __m128 _r02_2;
  __m128 _r01_2;
  __m128 _r00_2;
  __m128 _sum0_2;
  __m128 _r24_1;
  __m128 _r14_1;
  __m128 _r04_1;
  __m128 _r23_1;
  __m128 _r13_1;
  __m128 _r03_1;
  __m128 _sum1_1;
  __m128 _r22_1;
  __m128 _r21_1;
  __m128 _r20_1;
  __m128 _r12_1;
  __m128 _r11_1;
  __m128 _r10_1;
  __m128 _r02_1;
  __m128 _r01_1;
  __m128 _r00_1;
  __m128 _sum0_1;
  __m128 _r28;
  __m128 _r18;
  __m128 _r08;
  __m128 _r27;
  __m128 _r17;
  __m128 _r07;
  __m128 _sum3;
  __m128 _r26;
  __m128 _r16;
  __m128 _r06;
  __m128 _r25;
  __m128 _r15;
  __m128 _r05;
  __m128 _sum2;
  __m128 _r24;
  __m128 _r14;
  __m128 _r04;
  __m128 _r23;
  __m128 _r13;
  __m128 _r03;
  __m128 _sum1;
  __m128 _r22;
  __m128 _r21;
  __m128 _r20;
  __m128 _r12;
  __m128 _r11;
  __m128 _r10;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  __m128 _sum0;
  int j;
  int i;
  __m128 _k22;
  __m128 _k21;
  __m128 _k20;
  __m128 _k12;
  __m128 _k11;
  __m128 _k10;
  __m128 _k02;
  __m128 _k01;
  __m128 _k00;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m128 _bias0;
  Mat out;
  int g;
  float *bias;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  float in_stack_ffffffffffffd444;
  float in_stack_ffffffffffffd448;
  float in_stack_ffffffffffffd44c;
  undefined8 local_2408;
  undefined8 uStack_2400;
  int local_2040;
  int local_203c;
  float *local_1fa8;
  float *local_1fa0;
  float *local_1f98;
  Mat local_1f90;
  float *local_1f48;
  float *local_1f40;
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  Mat local_1f10;
  int local_1ec4;
  float *local_1ec0;
  int local_1eb4;
  int local_1eb0;
  int local_1eac;
  int local_1ea8;
  int local_1ea4;
  Mat *local_1e90;
  undefined4 local_1e78;
  undefined4 uStack_1e74;
  undefined4 uStack_1e70;
  undefined4 uStack_1e6c;
  undefined4 local_1e68;
  float *pfStack_1e60;
  float *local_1e58;
  float *local_1e50;
  float *local_1e48;
  float *local_1e40;
  float *local_1e38;
  float *local_1e30;
  float *local_1e28;
  float *local_1e20;
  float *local_1e18;
  float *local_1e10;
  float *local_1e08;
  float *local_1e00;
  float *local_1df8;
  float *local_1df0;
  float *local_1de8;
  float *local_1de0;
  float *local_1dd8;
  float *local_1dd0;
  float *local_1dc8;
  float *local_1dc0;
  float *local_1db8;
  float *local_1db0;
  float *local_1da8;
  float *local_1da0;
  float *local_1d98;
  float *local_1d90;
  float *local_1d88;
  float *local_1d80;
  float *local_1d78;
  float *local_1d70;
  float *local_1d68;
  float *local_1d60;
  float *local_1d58;
  float *local_1d50;
  float *local_1d48;
  float *local_1d40;
  float *local_1d38;
  float *local_1d30;
  float *local_1d28;
  float *local_1d20;
  float *local_1d18;
  float *local_1d10;
  float *local_1d08;
  float *local_1d00;
  float *local_1cf8;
  float *local_1cf0;
  float *local_1ce8;
  float *local_1ce0;
  float *local_1cd8;
  float *local_1cd0;
  float *local_1cc8;
  float *local_1cc0;
  float *local_1cb8;
  float *local_1cb0;
  float *local_1ca8;
  float *local_1ca0;
  float *local_1c98;
  float *local_1c90;
  float *local_1c88;
  float *local_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  float *local_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  float *local_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  float *local_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  float *local_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  float *local_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  float *local_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  float *local_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  float local_1b58;
  float fStack_1b54;
  float fStack_1b50;
  float fStack_1b4c;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  float local_1ae8;
  float fStack_1ae4;
  float fStack_1ae0;
  float fStack_1adc;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  float local_1a78;
  float fStack_1a74;
  float fStack_1a70;
  float fStack_1a6c;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  float local_1a08;
  float fStack_1a04;
  float fStack_1a00;
  float fStack_19fc;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  float local_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  float local_1928;
  float fStack_1924;
  float fStack_1920;
  float fStack_191c;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  float local_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  float local_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  float local_1688;
  float fStack_1684;
  float fStack_1680;
  float fStack_167c;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  float local_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  float local_15a8;
  float fStack_15a4;
  float fStack_15a0;
  float fStack_159c;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  float local_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  float local_14c8;
  float fStack_14c4;
  float fStack_14c0;
  float fStack_14bc;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  float local_13e8;
  float fStack_13e4;
  float fStack_13e0;
  float fStack_13dc;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  float local_ea8;
  float fStack_ea4;
  float fStack_ea0;
  float fStack_e9c;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  float local_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  float local_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  float local_ce8;
  float fStack_ce4;
  float fStack_ce0;
  float fStack_cdc;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  float local_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_1ea4 = *(int *)(in_RDI + 0x2c);
  local_1ea8 = *(int *)(in_RSI + 0x2c);
  local_1eac = *(int *)(in_RSI + 0x30);
  local_1eb0 = *(int *)(in_RDI + 0x38);
  local_1eb4 = (local_1ea4 * 2 + local_1ea8 * -2) * 4;
  local_1e90 = in_RDX;
  local_1ec0 = Mat::operator_cast_to_float_(in_RCX);
  for (local_1ec4 = 0; local_1ec4 < local_1eb0; local_1ec4 = local_1ec4 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffd44c,in_stack_ffffffffffffd448),
                 (int)in_stack_ffffffffffffd444);
    if (local_1ec0 == (float *)0x0) {
      local_1e68 = 0;
      local_1e78 = 0;
      uStack_1e74 = 0;
      uStack_1e70 = 0;
      uStack_1e6c = 0;
      local_2408 = 0;
      uStack_2400 = 0;
    }
    else {
      local_1c80 = local_1ec0 + (local_1ec4 << 2);
      local_2408 = *(undefined8 *)local_1c80;
      uStack_2400 = *(undefined8 *)(local_1c80 + 2);
    }
    local_1f28 = local_2408;
    uStack_1f20 = uStack_2400;
    local_1f40 = Mat::row(local_1e90,local_1ec4);
    local_1f48 = Mat::row(&local_1f10,0);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffd44c,in_stack_ffffffffffffd448),
                 (int)in_stack_ffffffffffffd444);
    local_1f98 = Mat::row(&local_1f90,0);
    local_1fa0 = Mat::row(&local_1f90,1);
    local_1fa8 = Mat::row(&local_1f90,2);
    local_1c88 = local_1f40;
    uVar1 = *(undefined8 *)local_1f40;
    uVar2 = *(undefined8 *)(local_1f40 + 2);
    local_1c90 = local_1f40 + 4;
    uVar3 = *(undefined8 *)local_1c90;
    uVar4 = *(undefined8 *)(local_1f40 + 6);
    local_1c98 = local_1f40 + 8;
    uVar5 = *(undefined8 *)local_1c98;
    uVar6 = *(undefined8 *)(local_1f40 + 10);
    local_1ca0 = local_1f40 + 0xc;
    uVar7 = *(undefined8 *)local_1ca0;
    uVar8 = *(undefined8 *)(local_1f40 + 0xe);
    local_1ca8 = local_1f40 + 0x10;
    uVar9 = *(undefined8 *)local_1ca8;
    uVar10 = *(undefined8 *)(local_1f40 + 0x12);
    local_1cb0 = local_1f40 + 0x14;
    uVar11 = *(undefined8 *)local_1cb0;
    uVar12 = *(undefined8 *)(local_1f40 + 0x16);
    local_1cb8 = local_1f40 + 0x18;
    uVar13 = *(undefined8 *)local_1cb8;
    uVar14 = *(undefined8 *)(local_1f40 + 0x1a);
    local_1cc0 = local_1f40 + 0x1c;
    uVar15 = *(undefined8 *)local_1cc0;
    uVar16 = *(undefined8 *)(local_1f40 + 0x1e);
    local_1cc8 = local_1f40 + 0x20;
    uVar17 = *(undefined8 *)local_1cc8;
    uVar18 = *(undefined8 *)(local_1f40 + 0x22);
    for (local_203c = 0; local_203c < local_1eac; local_203c = local_203c + 1) {
      local_2040 = 0;
      while( true ) {
        uVar38 = uStack_10;
        uVar37 = local_18;
        uVar36 = uStack_40;
        uVar35 = local_48;
        uVar34 = uStack_80;
        uVar33 = local_88;
        uVar32 = uStack_f0;
        uVar31 = local_f8;
        uVar30 = uStack_160;
        uVar29 = local_168;
        uVar28 = uStack_1d0;
        uVar27 = local_1d8;
        uVar26 = uStack_240;
        uVar25 = local_248;
        uVar24 = uStack_2b0;
        uVar23 = local_2b8;
        uVar22 = uStack_320;
        uVar21 = local_328;
        uVar20 = uStack_390;
        uVar19 = local_398;
        local_18._0_4_ = (float)uVar1;
        local_18._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_10._0_4_ = (float)uVar2;
        uStack_10._4_4_ = (float)((ulong)uVar2 >> 0x20);
        local_48._0_4_ = (float)local_1f28;
        local_48._4_4_ = (float)((ulong)local_1f28 >> 0x20);
        uStack_40._0_4_ = (float)uStack_1f20;
        uStack_40._4_4_ = (float)((ulong)uStack_1f20 >> 0x20);
        local_88._0_4_ = (float)uVar3;
        local_88._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_80._0_4_ = (float)uVar4;
        uStack_80._4_4_ = (float)((ulong)uVar4 >> 0x20);
        local_f8._0_4_ = (float)uVar5;
        local_f8._4_4_ = (float)((ulong)uVar5 >> 0x20);
        uStack_f0._0_4_ = (float)uVar6;
        uStack_f0._4_4_ = (float)((ulong)uVar6 >> 0x20);
        local_168._0_4_ = (float)uVar7;
        local_168._4_4_ = (float)((ulong)uVar7 >> 0x20);
        uStack_160._0_4_ = (float)uVar8;
        uStack_160._4_4_ = (float)((ulong)uVar8 >> 0x20);
        local_1d8._0_4_ = (float)uVar9;
        local_1d8._4_4_ = (float)((ulong)uVar9 >> 0x20);
        uStack_1d0._0_4_ = (float)uVar10;
        uStack_1d0._4_4_ = (float)((ulong)uVar10 >> 0x20);
        local_248._0_4_ = (float)uVar11;
        local_248._4_4_ = (float)((ulong)uVar11 >> 0x20);
        uStack_240._0_4_ = (float)uVar12;
        uStack_240._4_4_ = (float)((ulong)uVar12 >> 0x20);
        local_2b8._0_4_ = (float)uVar13;
        local_2b8._4_4_ = (float)((ulong)uVar13 >> 0x20);
        uStack_2b0._0_4_ = (float)uVar14;
        uStack_2b0._4_4_ = (float)((ulong)uVar14 >> 0x20);
        local_328._0_4_ = (float)uVar15;
        local_328._4_4_ = (float)((ulong)uVar15 >> 0x20);
        uStack_320._0_4_ = (float)uVar16;
        uStack_320._4_4_ = (float)((ulong)uVar16 >> 0x20);
        local_398._0_4_ = (float)uVar17;
        local_398._4_4_ = (float)((ulong)uVar17 >> 0x20);
        uStack_390._0_4_ = (float)uVar18;
        uStack_390._4_4_ = (float)((ulong)uVar18 >> 0x20);
        if (local_1ea8 <= local_2040 + 3) break;
        local_1cd0 = local_1f98;
        local_68 = *(undefined8 *)local_1f98;
        uStack_60 = *(undefined8 *)(local_1f98 + 2);
        local_1cd8 = local_1f98 + 4;
        local_d8 = *(undefined8 *)local_1cd8;
        uStack_d0 = *(undefined8 *)(local_1f98 + 6);
        local_1ce0 = local_1f98 + 8;
        local_458 = *(undefined8 *)local_1ce0;
        uStack_450 = *(undefined8 *)(local_1f98 + 10);
        local_1ce8 = local_1fa0;
        local_1b8 = *(undefined8 *)local_1fa0;
        uStack_1b0 = *(undefined8 *)(local_1fa0 + 2);
        local_1cf0 = local_1fa0 + 4;
        local_228 = *(undefined8 *)local_1cf0;
        uStack_220 = *(undefined8 *)(local_1fa0 + 6);
        local_1cf8 = local_1fa0 + 8;
        local_5a8 = *(undefined8 *)local_1cf8;
        uStack_5a0 = *(undefined8 *)(local_1fa0 + 10);
        local_1d00 = local_1fa8;
        local_308 = *(undefined8 *)local_1fa8;
        uStack_300 = *(undefined8 *)(local_1fa8 + 2);
        local_1d08 = local_1fa8 + 4;
        local_378 = *(undefined8 *)local_1d08;
        uStack_370 = *(undefined8 *)(local_1fa8 + 6);
        local_1d10 = local_1fa8 + 8;
        local_6f8 = *(undefined8 *)local_1d10;
        uStack_6f0 = *(undefined8 *)(local_1fa8 + 10);
        local_78 = local_1f28;
        uStack_70 = uStack_1f20;
        local_28._0_4_ = (float)local_68;
        local_28._4_4_ = (float)((ulong)local_68 >> 0x20);
        uStack_20._0_4_ = (float)uStack_60;
        uStack_20._4_4_ = (float)((ulong)uStack_60 >> 0x20);
        local_38 = (float)local_18 * (float)local_28;
        fStack_34 = local_18._4_4_ * local_28._4_4_;
        fStack_30 = (float)uStack_10 * (float)uStack_20;
        fStack_2c = uStack_10._4_4_ * uStack_20._4_4_;
        local_e8 = CONCAT44(fStack_34 + local_48._4_4_,local_38 + (float)local_48);
        uStack_e0 = CONCAT44(fStack_2c + uStack_40._4_4_,fStack_30 + (float)uStack_40);
        local_98._0_4_ = (float)local_d8;
        local_98._4_4_ = (float)((ulong)local_d8 >> 0x20);
        uStack_90._0_4_ = (float)uStack_d0;
        uStack_90._4_4_ = (float)((ulong)uStack_d0 >> 0x20);
        local_a8 = (float)local_88 * (float)local_98;
        fStack_a4 = local_88._4_4_ * local_98._4_4_;
        fStack_a0 = (float)uStack_80 * (float)uStack_90;
        fStack_9c = uStack_80._4_4_ * uStack_90._4_4_;
        fVar39 = local_a8 + local_38 + (float)local_48;
        fVar40 = fStack_a4 + fStack_34 + local_48._4_4_;
        fVar41 = fStack_a0 + fStack_30 + (float)uStack_40;
        fVar42 = fStack_9c + fStack_2c + uStack_40._4_4_;
        local_158 = CONCAT44(fVar40,fVar39);
        uStack_150 = CONCAT44(fVar42,fVar41);
        local_108._0_4_ = (float)local_458;
        local_108._4_4_ = (float)((ulong)local_458 >> 0x20);
        uStack_100._0_4_ = (float)uStack_450;
        uStack_100._4_4_ = (float)((ulong)uStack_450 >> 0x20);
        local_118 = (float)local_f8 * (float)local_108;
        fStack_114 = local_f8._4_4_ * local_108._4_4_;
        fStack_110 = (float)uStack_f0 * (float)uStack_100;
        fStack_10c = uStack_f0._4_4_ * uStack_100._4_4_;
        fVar39 = local_118 + fVar39;
        fVar40 = fStack_114 + fVar40;
        fVar41 = fStack_110 + fVar41;
        fVar42 = fStack_10c + fVar42;
        local_1c8 = CONCAT44(fVar40,fVar39);
        uStack_1c0 = CONCAT44(fVar42,fVar41);
        local_178._0_4_ = (float)local_1b8;
        local_178._4_4_ = (float)((ulong)local_1b8 >> 0x20);
        uStack_170._0_4_ = (float)uStack_1b0;
        uStack_170._4_4_ = (float)((ulong)uStack_1b0 >> 0x20);
        local_188 = (float)local_168 * (float)local_178;
        fStack_184 = local_168._4_4_ * local_178._4_4_;
        fStack_180 = (float)uStack_160 * (float)uStack_170;
        fStack_17c = uStack_160._4_4_ * uStack_170._4_4_;
        fVar39 = local_188 + fVar39;
        fVar40 = fStack_184 + fVar40;
        fVar41 = fStack_180 + fVar41;
        fVar42 = fStack_17c + fVar42;
        local_238 = CONCAT44(fVar40,fVar39);
        uStack_230 = CONCAT44(fVar42,fVar41);
        local_1e8._0_4_ = (float)local_228;
        local_1e8._4_4_ = (float)((ulong)local_228 >> 0x20);
        uStack_1e0._0_4_ = (float)uStack_220;
        uStack_1e0._4_4_ = (float)((ulong)uStack_220 >> 0x20);
        local_1f8 = (float)local_1d8 * (float)local_1e8;
        fStack_1f4 = local_1d8._4_4_ * local_1e8._4_4_;
        fStack_1f0 = (float)uStack_1d0 * (float)uStack_1e0;
        fStack_1ec = uStack_1d0._4_4_ * uStack_1e0._4_4_;
        fVar39 = local_1f8 + fVar39;
        fVar40 = fStack_1f4 + fVar40;
        fVar41 = fStack_1f0 + fVar41;
        fVar42 = fStack_1ec + fVar42;
        local_2a8 = CONCAT44(fVar40,fVar39);
        uStack_2a0 = CONCAT44(fVar42,fVar41);
        local_258._0_4_ = (float)local_5a8;
        local_258._4_4_ = (float)((ulong)local_5a8 >> 0x20);
        uStack_250._0_4_ = (float)uStack_5a0;
        uStack_250._4_4_ = (float)((ulong)uStack_5a0 >> 0x20);
        local_268 = (float)local_248 * (float)local_258;
        fStack_264 = local_248._4_4_ * local_258._4_4_;
        fStack_260 = (float)uStack_240 * (float)uStack_250;
        fStack_25c = uStack_240._4_4_ * uStack_250._4_4_;
        fVar39 = local_268 + fVar39;
        fVar40 = fStack_264 + fVar40;
        fVar41 = fStack_260 + fVar41;
        fVar42 = fStack_25c + fVar42;
        local_318 = CONCAT44(fVar40,fVar39);
        uStack_310 = CONCAT44(fVar42,fVar41);
        local_2c8._0_4_ = (float)local_308;
        local_2c8._4_4_ = (float)((ulong)local_308 >> 0x20);
        uStack_2c0._0_4_ = (float)uStack_300;
        uStack_2c0._4_4_ = (float)((ulong)uStack_300 >> 0x20);
        local_2d8 = (float)local_2b8 * (float)local_2c8;
        fStack_2d4 = local_2b8._4_4_ * local_2c8._4_4_;
        fStack_2d0 = (float)uStack_2b0 * (float)uStack_2c0;
        fStack_2cc = uStack_2b0._4_4_ * uStack_2c0._4_4_;
        fVar39 = local_2d8 + fVar39;
        fVar40 = fStack_2d4 + fVar40;
        fVar41 = fStack_2d0 + fVar41;
        fVar42 = fStack_2cc + fVar42;
        local_388 = CONCAT44(fVar40,fVar39);
        uStack_380 = CONCAT44(fVar42,fVar41);
        local_338._0_4_ = (float)local_378;
        local_338._4_4_ = (float)((ulong)local_378 >> 0x20);
        uStack_330._0_4_ = (float)uStack_370;
        uStack_330._4_4_ = (float)((ulong)uStack_370 >> 0x20);
        local_348 = (float)local_328 * (float)local_338;
        fStack_344 = local_328._4_4_ * local_338._4_4_;
        fStack_340 = (float)uStack_320 * (float)uStack_330;
        fStack_33c = uStack_320._4_4_ * uStack_330._4_4_;
        fVar39 = local_348 + fVar39;
        fVar40 = fStack_344 + fVar40;
        fVar41 = fStack_340 + fVar41;
        fVar42 = fStack_33c + fVar42;
        local_3f8 = CONCAT44(fVar40,fVar39);
        uStack_3f0 = CONCAT44(fVar42,fVar41);
        local_3a8._0_4_ = (float)local_6f8;
        local_3a8._4_4_ = (float)((ulong)local_6f8 >> 0x20);
        uStack_3a0._0_4_ = (float)uStack_6f0;
        uStack_3a0._4_4_ = (float)((ulong)uStack_6f0 >> 0x20);
        local_3b8 = (float)local_398 * (float)local_3a8;
        fStack_3b4 = local_398._4_4_ * local_3a8._4_4_;
        fStack_3b0 = (float)uStack_390 * (float)uStack_3a0;
        fStack_3ac = uStack_390._4_4_ * uStack_3a0._4_4_;
        local_1bb8 = CONCAT44(fStack_3b4 + fVar40,local_3b8 + fVar39);
        uStack_1bb0 = CONCAT44(fStack_3ac + fVar42,fStack_3b0 + fVar41);
        local_1d18 = local_1f98 + 0xc;
        local_4c8 = *(undefined8 *)local_1d18;
        uStack_4c0 = *(undefined8 *)(local_1f98 + 0xe);
        local_1d20 = local_1fa0 + 0xc;
        local_618 = *(undefined8 *)local_1d20;
        uStack_610 = *(undefined8 *)(local_1fa0 + 0xe);
        local_1d28 = local_1fa8 + 0xc;
        local_768 = *(undefined8 *)local_1d28;
        uStack_760 = *(undefined8 *)(local_1fa8 + 0xe);
        local_1d30 = local_1f98 + 0x10;
        local_848 = *(undefined8 *)local_1d30;
        uStack_840 = *(undefined8 *)(local_1f98 + 0x12);
        local_1d38 = local_1fa0 + 0x10;
        local_998 = *(undefined8 *)local_1d38;
        uStack_990 = *(undefined8 *)(local_1fa0 + 0x12);
        local_1d40 = local_1fa8 + 0x10;
        local_ae8 = *(undefined8 *)local_1d40;
        uStack_ae0 = *(undefined8 *)(local_1fa8 + 0x12);
        local_1ba0 = local_1f48;
        *(undefined8 *)local_1f48 = local_1bb8;
        *(undefined8 *)(local_1f48 + 2) = uStack_1bb0;
        local_468 = local_1f28;
        uStack_460 = uStack_1f20;
        local_428 = (float)local_18 * (float)local_108;
        fStack_424 = local_18._4_4_ * local_108._4_4_;
        fStack_420 = (float)uStack_10 * (float)uStack_100;
        fStack_41c = uStack_10._4_4_ * uStack_100._4_4_;
        local_438 = local_1f28;
        uStack_430 = uStack_1f20;
        local_4d8 = CONCAT44(fStack_424 + local_48._4_4_,local_428 + (float)local_48);
        uStack_4d0 = CONCAT44(fStack_41c + uStack_40._4_4_,fStack_420 + (float)uStack_40);
        local_488._0_4_ = (float)local_4c8;
        local_488._4_4_ = (float)((ulong)local_4c8 >> 0x20);
        uStack_480._0_4_ = (float)uStack_4c0;
        uStack_480._4_4_ = (float)((ulong)uStack_4c0 >> 0x20);
        local_498 = (float)local_88 * (float)local_488;
        fStack_494 = local_88._4_4_ * local_488._4_4_;
        fStack_490 = (float)uStack_80 * (float)uStack_480;
        fStack_48c = uStack_80._4_4_ * uStack_480._4_4_;
        fVar39 = local_498 + local_428 + (float)local_48;
        fVar40 = fStack_494 + fStack_424 + local_48._4_4_;
        fVar41 = fStack_490 + fStack_420 + (float)uStack_40;
        fVar42 = fStack_48c + fStack_41c + uStack_40._4_4_;
        local_548 = CONCAT44(fVar40,fVar39);
        uStack_540 = CONCAT44(fVar42,fVar41);
        local_4f8._0_4_ = (float)local_848;
        local_4f8._4_4_ = (float)((ulong)local_848 >> 0x20);
        uStack_4f0._0_4_ = (float)uStack_840;
        uStack_4f0._4_4_ = (float)((ulong)uStack_840 >> 0x20);
        local_508 = (float)local_f8 * (float)local_4f8;
        fStack_504 = local_f8._4_4_ * local_4f8._4_4_;
        fStack_500 = (float)uStack_f0 * (float)uStack_4f0;
        fStack_4fc = uStack_f0._4_4_ * uStack_4f0._4_4_;
        fVar39 = local_508 + fVar39;
        fVar40 = fStack_504 + fVar40;
        fVar41 = fStack_500 + fVar41;
        fVar42 = fStack_4fc + fVar42;
        local_5b8 = CONCAT44(fVar40,fVar39);
        uStack_5b0 = CONCAT44(fVar42,fVar41);
        local_578 = (float)local_168 * (float)local_258;
        fStack_574 = local_168._4_4_ * local_258._4_4_;
        fStack_570 = (float)uStack_160 * (float)uStack_250;
        fStack_56c = uStack_160._4_4_ * uStack_250._4_4_;
        fVar39 = local_578 + fVar39;
        fVar40 = fStack_574 + fVar40;
        fVar41 = fStack_570 + fVar41;
        fVar42 = fStack_56c + fVar42;
        local_628 = CONCAT44(fVar40,fVar39);
        uStack_620 = CONCAT44(fVar42,fVar41);
        local_5d8._0_4_ = (float)local_618;
        local_5d8._4_4_ = (float)((ulong)local_618 >> 0x20);
        uStack_5d0._0_4_ = (float)uStack_610;
        uStack_5d0._4_4_ = (float)((ulong)uStack_610 >> 0x20);
        local_5e8 = (float)local_1d8 * (float)local_5d8;
        fStack_5e4 = local_1d8._4_4_ * local_5d8._4_4_;
        fStack_5e0 = (float)uStack_1d0 * (float)uStack_5d0;
        fStack_5dc = uStack_1d0._4_4_ * uStack_5d0._4_4_;
        fVar39 = local_5e8 + fVar39;
        fVar40 = fStack_5e4 + fVar40;
        fVar41 = fStack_5e0 + fVar41;
        fVar42 = fStack_5dc + fVar42;
        local_698 = CONCAT44(fVar40,fVar39);
        uStack_690 = CONCAT44(fVar42,fVar41);
        local_648._0_4_ = (float)local_998;
        local_648._4_4_ = (float)((ulong)local_998 >> 0x20);
        uStack_640._0_4_ = (float)uStack_990;
        uStack_640._4_4_ = (float)((ulong)uStack_990 >> 0x20);
        local_658 = (float)local_248 * (float)local_648;
        fStack_654 = local_248._4_4_ * local_648._4_4_;
        fStack_650 = (float)uStack_240 * (float)uStack_640;
        fStack_64c = uStack_240._4_4_ * uStack_640._4_4_;
        fVar39 = local_658 + fVar39;
        fVar40 = fStack_654 + fVar40;
        fVar41 = fStack_650 + fVar41;
        fVar42 = fStack_64c + fVar42;
        local_708 = CONCAT44(fVar40,fVar39);
        uStack_700 = CONCAT44(fVar42,fVar41);
        local_6c8 = (float)local_2b8 * (float)local_3a8;
        fStack_6c4 = local_2b8._4_4_ * local_3a8._4_4_;
        fStack_6c0 = (float)uStack_2b0 * (float)uStack_3a0;
        fStack_6bc = uStack_2b0._4_4_ * uStack_3a0._4_4_;
        fVar39 = local_6c8 + fVar39;
        fVar40 = fStack_6c4 + fVar40;
        fVar41 = fStack_6c0 + fVar41;
        fVar42 = fStack_6bc + fVar42;
        local_778 = CONCAT44(fVar40,fVar39);
        uStack_770 = CONCAT44(fVar42,fVar41);
        local_728._0_4_ = (float)local_768;
        local_728._4_4_ = (float)((ulong)local_768 >> 0x20);
        uStack_720._0_4_ = (float)uStack_760;
        uStack_720._4_4_ = (float)((ulong)uStack_760 >> 0x20);
        local_738 = (float)local_328 * (float)local_728;
        fStack_734 = local_328._4_4_ * local_728._4_4_;
        fStack_730 = (float)uStack_320 * (float)uStack_720;
        fStack_72c = uStack_320._4_4_ * uStack_720._4_4_;
        fVar39 = local_738 + fVar39;
        fVar40 = fStack_734 + fVar40;
        fVar41 = fStack_730 + fVar41;
        fVar42 = fStack_72c + fVar42;
        local_7e8 = CONCAT44(fVar40,fVar39);
        uStack_7e0 = CONCAT44(fVar42,fVar41);
        local_798._0_4_ = (float)local_ae8;
        local_798._4_4_ = (float)((ulong)local_ae8 >> 0x20);
        uStack_790._0_4_ = (float)uStack_ae0;
        uStack_790._4_4_ = (float)((ulong)uStack_ae0 >> 0x20);
        local_7a8 = (float)local_398 * (float)local_798;
        fStack_7a4 = local_398._4_4_ * local_798._4_4_;
        fStack_7a0 = (float)uStack_390 * (float)uStack_790;
        fStack_79c = uStack_390._4_4_ * uStack_790._4_4_;
        local_1bd8 = CONCAT44(fStack_7a4 + fVar40,local_7a8 + fVar39);
        uStack_1bd0 = CONCAT44(fStack_79c + fVar42,fStack_7a0 + fVar41);
        local_1d48 = local_1f98 + 0x14;
        local_8b8 = *(undefined8 *)local_1d48;
        uStack_8b0 = *(undefined8 *)(local_1f98 + 0x16);
        local_1d50 = local_1fa0 + 0x14;
        local_a08 = *(undefined8 *)local_1d50;
        uStack_a00 = *(undefined8 *)(local_1fa0 + 0x16);
        local_1d58 = local_1fa8 + 0x14;
        local_b58 = *(undefined8 *)local_1d58;
        uStack_b50 = *(undefined8 *)(local_1fa8 + 0x16);
        local_1d60 = local_1f98 + 0x18;
        local_c38 = *(undefined8 *)local_1d60;
        uStack_c30 = *(undefined8 *)(local_1f98 + 0x1a);
        local_1d68 = local_1fa0 + 0x18;
        local_d88 = *(undefined8 *)local_1d68;
        uStack_d80 = *(undefined8 *)(local_1fa0 + 0x1a);
        local_1d70 = local_1fa8 + 0x18;
        local_ed8 = *(undefined8 *)local_1d70;
        uStack_ed0 = *(undefined8 *)(local_1fa8 + 0x1a);
        local_1bc0 = local_1f48 + 4;
        *(undefined8 *)local_1bc0 = local_1bd8;
        *(undefined8 *)(local_1f48 + 6) = uStack_1bd0;
        local_858 = local_1f28;
        uStack_850 = uStack_1f20;
        local_818 = (float)local_18 * (float)local_4f8;
        fStack_814 = local_18._4_4_ * local_4f8._4_4_;
        fStack_810 = (float)uStack_10 * (float)uStack_4f0;
        fStack_80c = uStack_10._4_4_ * uStack_4f0._4_4_;
        local_828 = local_1f28;
        uStack_820 = uStack_1f20;
        local_8c8 = CONCAT44(fStack_814 + local_48._4_4_,local_818 + (float)local_48);
        uStack_8c0 = CONCAT44(fStack_80c + uStack_40._4_4_,fStack_810 + (float)uStack_40);
        local_878._0_4_ = (float)local_8b8;
        local_878._4_4_ = (float)((ulong)local_8b8 >> 0x20);
        uStack_870._0_4_ = (float)uStack_8b0;
        uStack_870._4_4_ = (float)((ulong)uStack_8b0 >> 0x20);
        local_888 = (float)local_88 * (float)local_878;
        fStack_884 = local_88._4_4_ * local_878._4_4_;
        fStack_880 = (float)uStack_80 * (float)uStack_870;
        fStack_87c = uStack_80._4_4_ * uStack_870._4_4_;
        fVar39 = local_888 + local_818 + (float)local_48;
        fVar40 = fStack_884 + fStack_814 + local_48._4_4_;
        fVar41 = fStack_880 + fStack_810 + (float)uStack_40;
        fVar42 = fStack_87c + fStack_80c + uStack_40._4_4_;
        local_938 = CONCAT44(fVar40,fVar39);
        uStack_930 = CONCAT44(fVar42,fVar41);
        local_8e8._0_4_ = (float)local_c38;
        local_8e8._4_4_ = (float)((ulong)local_c38 >> 0x20);
        uStack_8e0._0_4_ = (float)uStack_c30;
        uStack_8e0._4_4_ = (float)((ulong)uStack_c30 >> 0x20);
        local_8f8 = (float)local_f8 * (float)local_8e8;
        fStack_8f4 = local_f8._4_4_ * local_8e8._4_4_;
        fStack_8f0 = (float)uStack_f0 * (float)uStack_8e0;
        fStack_8ec = uStack_f0._4_4_ * uStack_8e0._4_4_;
        fVar39 = local_8f8 + fVar39;
        fVar40 = fStack_8f4 + fVar40;
        fVar41 = fStack_8f0 + fVar41;
        fVar42 = fStack_8ec + fVar42;
        local_9a8 = CONCAT44(fVar40,fVar39);
        uStack_9a0 = CONCAT44(fVar42,fVar41);
        local_968 = (float)local_168 * (float)local_648;
        fStack_964 = local_168._4_4_ * local_648._4_4_;
        fStack_960 = (float)uStack_160 * (float)uStack_640;
        fStack_95c = uStack_160._4_4_ * uStack_640._4_4_;
        fVar39 = local_968 + fVar39;
        fVar40 = fStack_964 + fVar40;
        fVar41 = fStack_960 + fVar41;
        fVar42 = fStack_95c + fVar42;
        local_a18 = CONCAT44(fVar40,fVar39);
        uStack_a10 = CONCAT44(fVar42,fVar41);
        local_9c8._0_4_ = (float)local_a08;
        local_9c8._4_4_ = (float)((ulong)local_a08 >> 0x20);
        uStack_9c0._0_4_ = (float)uStack_a00;
        uStack_9c0._4_4_ = (float)((ulong)uStack_a00 >> 0x20);
        local_9d8 = (float)local_1d8 * (float)local_9c8;
        fStack_9d4 = local_1d8._4_4_ * local_9c8._4_4_;
        fStack_9d0 = (float)uStack_1d0 * (float)uStack_9c0;
        fStack_9cc = uStack_1d0._4_4_ * uStack_9c0._4_4_;
        fVar39 = local_9d8 + fVar39;
        fVar40 = fStack_9d4 + fVar40;
        fVar41 = fStack_9d0 + fVar41;
        fVar42 = fStack_9cc + fVar42;
        local_a88 = CONCAT44(fVar40,fVar39);
        uStack_a80 = CONCAT44(fVar42,fVar41);
        local_a38._0_4_ = (float)local_d88;
        local_a38._4_4_ = (float)((ulong)local_d88 >> 0x20);
        uStack_a30._0_4_ = (float)uStack_d80;
        uStack_a30._4_4_ = (float)((ulong)uStack_d80 >> 0x20);
        local_a48 = (float)local_248 * (float)local_a38;
        fStack_a44 = local_248._4_4_ * local_a38._4_4_;
        fStack_a40 = (float)uStack_240 * (float)uStack_a30;
        fStack_a3c = uStack_240._4_4_ * uStack_a30._4_4_;
        fVar39 = local_a48 + fVar39;
        fVar40 = fStack_a44 + fVar40;
        fVar41 = fStack_a40 + fVar41;
        fVar42 = fStack_a3c + fVar42;
        local_af8 = CONCAT44(fVar40,fVar39);
        uStack_af0 = CONCAT44(fVar42,fVar41);
        local_ab8 = (float)local_2b8 * (float)local_798;
        fStack_ab4 = local_2b8._4_4_ * local_798._4_4_;
        fStack_ab0 = (float)uStack_2b0 * (float)uStack_790;
        fStack_aac = uStack_2b0._4_4_ * uStack_790._4_4_;
        fVar39 = local_ab8 + fVar39;
        fVar40 = fStack_ab4 + fVar40;
        fVar41 = fStack_ab0 + fVar41;
        fVar42 = fStack_aac + fVar42;
        local_b68 = CONCAT44(fVar40,fVar39);
        uStack_b60 = CONCAT44(fVar42,fVar41);
        local_b18._0_4_ = (float)local_b58;
        local_b18._4_4_ = (float)((ulong)local_b58 >> 0x20);
        uStack_b10._0_4_ = (float)uStack_b50;
        uStack_b10._4_4_ = (float)((ulong)uStack_b50 >> 0x20);
        local_b28 = (float)local_328 * (float)local_b18;
        fStack_b24 = local_328._4_4_ * local_b18._4_4_;
        fStack_b20 = (float)uStack_320 * (float)uStack_b10;
        fStack_b1c = uStack_320._4_4_ * uStack_b10._4_4_;
        fVar39 = local_b28 + fVar39;
        fVar40 = fStack_b24 + fVar40;
        fVar41 = fStack_b20 + fVar41;
        fVar42 = fStack_b1c + fVar42;
        local_bd8 = CONCAT44(fVar40,fVar39);
        uStack_bd0 = CONCAT44(fVar42,fVar41);
        local_b88._0_4_ = (float)local_ed8;
        local_b88._4_4_ = (float)((ulong)local_ed8 >> 0x20);
        uStack_b80._0_4_ = (float)uStack_ed0;
        uStack_b80._4_4_ = (float)((ulong)uStack_ed0 >> 0x20);
        local_b98 = (float)local_398 * (float)local_b88;
        fStack_b94 = local_398._4_4_ * local_b88._4_4_;
        fStack_b90 = (float)uStack_390 * (float)uStack_b80;
        fStack_b8c = uStack_390._4_4_ * uStack_b80._4_4_;
        local_1bf8 = CONCAT44(fStack_b94 + fVar40,local_b98 + fVar39);
        uStack_1bf0 = CONCAT44(fStack_b8c + fVar42,fStack_b90 + fVar41);
        local_1d78 = local_1f98 + 0x1c;
        local_ca8 = *(undefined8 *)local_1d78;
        uStack_ca0 = *(undefined8 *)(local_1f98 + 0x1e);
        local_1d80 = local_1fa0 + 0x1c;
        local_df8 = *(undefined8 *)local_1d80;
        uStack_df0 = *(undefined8 *)(local_1fa0 + 0x1e);
        local_1d88 = local_1fa8 + 0x1c;
        local_f48 = *(undefined8 *)local_1d88;
        uStack_f40 = *(undefined8 *)(local_1fa8 + 0x1e);
        local_1d90 = local_1f98 + 0x20;
        local_d18 = *(undefined8 *)local_1d90;
        uStack_d10 = *(undefined8 *)(local_1f98 + 0x22);
        local_1d98 = local_1fa0 + 0x20;
        local_e68 = *(undefined8 *)local_1d98;
        uStack_e60 = *(undefined8 *)(local_1fa0 + 0x22);
        local_1da0 = local_1fa8 + 0x20;
        local_fb8 = *(undefined8 *)local_1da0;
        uStack_fb0 = *(undefined8 *)(local_1fa8 + 0x22);
        local_1be0 = local_1f48 + 8;
        *(undefined8 *)local_1be0 = local_1bf8;
        *(undefined8 *)(local_1f48 + 10) = uStack_1bf0;
        local_c48 = local_1f28;
        uStack_c40 = uStack_1f20;
        local_c08 = (float)local_18 * (float)local_8e8;
        fStack_c04 = local_18._4_4_ * local_8e8._4_4_;
        fStack_c00 = (float)uStack_10 * (float)uStack_8e0;
        fStack_bfc = uStack_10._4_4_ * uStack_8e0._4_4_;
        local_c18 = local_1f28;
        uStack_c10 = uStack_1f20;
        local_cb8 = CONCAT44(fStack_c04 + local_48._4_4_,local_c08 + (float)local_48);
        uStack_cb0 = CONCAT44(fStack_bfc + uStack_40._4_4_,fStack_c00 + (float)uStack_40);
        local_c68._0_4_ = (float)local_ca8;
        local_c68._4_4_ = (float)((ulong)local_ca8 >> 0x20);
        uStack_c60._0_4_ = (float)uStack_ca0;
        uStack_c60._4_4_ = (float)((ulong)uStack_ca0 >> 0x20);
        local_c78 = (float)local_88 * (float)local_c68;
        fStack_c74 = local_88._4_4_ * local_c68._4_4_;
        fStack_c70 = (float)uStack_80 * (float)uStack_c60;
        fStack_c6c = uStack_80._4_4_ * uStack_c60._4_4_;
        fVar39 = local_c78 + local_c08 + (float)local_48;
        fVar40 = fStack_c74 + fStack_c04 + local_48._4_4_;
        fVar41 = fStack_c70 + fStack_c00 + (float)uStack_40;
        fVar42 = fStack_c6c + fStack_bfc + uStack_40._4_4_;
        local_d28 = CONCAT44(fVar40,fVar39);
        uStack_d20 = CONCAT44(fVar42,fVar41);
        local_cd8._0_4_ = (float)local_d18;
        local_cd8._4_4_ = (float)((ulong)local_d18 >> 0x20);
        uStack_cd0._0_4_ = (float)uStack_d10;
        uStack_cd0._4_4_ = (float)((ulong)uStack_d10 >> 0x20);
        local_ce8 = (float)local_f8 * (float)local_cd8;
        fStack_ce4 = local_f8._4_4_ * local_cd8._4_4_;
        fStack_ce0 = (float)uStack_f0 * (float)uStack_cd0;
        fStack_cdc = uStack_f0._4_4_ * uStack_cd0._4_4_;
        fVar39 = local_ce8 + fVar39;
        fVar40 = fStack_ce4 + fVar40;
        fVar41 = fStack_ce0 + fVar41;
        fVar42 = fStack_cdc + fVar42;
        local_d98 = CONCAT44(fVar40,fVar39);
        uStack_d90 = CONCAT44(fVar42,fVar41);
        local_d58 = (float)local_168 * (float)local_a38;
        fStack_d54 = local_168._4_4_ * local_a38._4_4_;
        fStack_d50 = (float)uStack_160 * (float)uStack_a30;
        fStack_d4c = uStack_160._4_4_ * uStack_a30._4_4_;
        fVar39 = local_d58 + fVar39;
        fVar40 = fStack_d54 + fVar40;
        fVar41 = fStack_d50 + fVar41;
        fVar42 = fStack_d4c + fVar42;
        local_e08 = CONCAT44(fVar40,fVar39);
        uStack_e00 = CONCAT44(fVar42,fVar41);
        local_db8._0_4_ = (float)local_df8;
        local_db8._4_4_ = (float)((ulong)local_df8 >> 0x20);
        uStack_db0._0_4_ = (float)uStack_df0;
        uStack_db0._4_4_ = (float)((ulong)uStack_df0 >> 0x20);
        local_dc8 = (float)local_1d8 * (float)local_db8;
        fStack_dc4 = local_1d8._4_4_ * local_db8._4_4_;
        fStack_dc0 = (float)uStack_1d0 * (float)uStack_db0;
        fStack_dbc = uStack_1d0._4_4_ * uStack_db0._4_4_;
        fVar39 = local_dc8 + fVar39;
        fVar40 = fStack_dc4 + fVar40;
        fVar41 = fStack_dc0 + fVar41;
        fVar42 = fStack_dbc + fVar42;
        local_e78 = CONCAT44(fVar40,fVar39);
        uStack_e70 = CONCAT44(fVar42,fVar41);
        local_e28._0_4_ = (float)local_e68;
        local_e28._4_4_ = (float)((ulong)local_e68 >> 0x20);
        uStack_e20._0_4_ = (float)uStack_e60;
        uStack_e20._4_4_ = (float)((ulong)uStack_e60 >> 0x20);
        local_e38 = (float)local_248 * (float)local_e28;
        fStack_e34 = local_248._4_4_ * local_e28._4_4_;
        fStack_e30 = (float)uStack_240 * (float)uStack_e20;
        fStack_e2c = uStack_240._4_4_ * uStack_e20._4_4_;
        fVar39 = local_e38 + fVar39;
        fVar40 = fStack_e34 + fVar40;
        fVar41 = fStack_e30 + fVar41;
        fVar42 = fStack_e2c + fVar42;
        local_ee8 = CONCAT44(fVar40,fVar39);
        uStack_ee0 = CONCAT44(fVar42,fVar41);
        local_ea8 = (float)local_2b8 * (float)local_b88;
        fStack_ea4 = local_2b8._4_4_ * local_b88._4_4_;
        fStack_ea0 = (float)uStack_2b0 * (float)uStack_b80;
        fStack_e9c = uStack_2b0._4_4_ * uStack_b80._4_4_;
        fVar39 = local_ea8 + fVar39;
        fVar40 = fStack_ea4 + fVar40;
        fVar41 = fStack_ea0 + fVar41;
        fVar42 = fStack_e9c + fVar42;
        local_f58 = CONCAT44(fVar40,fVar39);
        uStack_f50 = CONCAT44(fVar42,fVar41);
        local_f08._0_4_ = (float)local_f48;
        local_f08._4_4_ = (float)((ulong)local_f48 >> 0x20);
        uStack_f00._0_4_ = (float)uStack_f40;
        uStack_f00._4_4_ = (float)((ulong)uStack_f40 >> 0x20);
        local_f18 = (float)local_328 * (float)local_f08;
        fStack_f14 = local_328._4_4_ * local_f08._4_4_;
        fStack_f10 = (float)uStack_320 * (float)uStack_f00;
        fStack_f0c = uStack_320._4_4_ * uStack_f00._4_4_;
        fVar39 = local_f18 + fVar39;
        fVar40 = fStack_f14 + fVar40;
        fVar41 = fStack_f10 + fVar41;
        fVar42 = fStack_f0c + fVar42;
        local_fc8 = CONCAT44(fVar40,fVar39);
        uStack_fc0 = CONCAT44(fVar42,fVar41);
        local_f78._0_4_ = (float)local_fb8;
        local_f78._4_4_ = (float)((ulong)local_fb8 >> 0x20);
        uStack_f70._0_4_ = (float)uStack_fb0;
        uStack_f70._4_4_ = (float)((ulong)uStack_fb0 >> 0x20);
        local_f88 = (float)local_398 * (float)local_f78;
        fStack_f84 = local_398._4_4_ * local_f78._4_4_;
        fStack_f80 = (float)uStack_390 * (float)uStack_f70;
        fStack_f7c = uStack_390._4_4_ * uStack_f70._4_4_;
        local_1c18 = CONCAT44(fStack_f84 + fVar40,local_f88 + fVar39);
        uStack_1c10 = CONCAT44(fStack_f7c + fVar42,fStack_f80 + fVar41);
        local_1c00 = local_1f48 + 0xc;
        *(undefined8 *)local_1c00 = local_1c18;
        *(undefined8 *)(local_1f48 + 0xe) = uStack_1c10;
        local_1f98 = local_1f98 + 0x20;
        local_1fa0 = local_1fa0 + 0x20;
        local_1fa8 = local_1fa8 + 0x20;
        local_1f48 = local_1f48 + 0x10;
        local_2040 = local_2040 + 4;
        local_fa8 = uVar17;
        uStack_fa0 = uVar18;
        local_f98 = local_fc8;
        uStack_f90 = uStack_fc0;
        local_f78 = local_fb8;
        uStack_f70 = uStack_fb0;
        local_f68 = uVar17;
        uStack_f60 = uVar18;
        local_f38 = uVar15;
        uStack_f30 = uVar16;
        local_f28 = local_f58;
        uStack_f20 = uStack_f50;
        local_f08 = local_f48;
        uStack_f00 = uStack_f40;
        local_ef8 = uVar15;
        uStack_ef0 = uVar16;
        local_ec8 = uVar13;
        uStack_ec0 = uVar14;
        local_eb8 = local_ee8;
        uStack_eb0 = uStack_ee0;
        local_e98 = local_ed8;
        uStack_e90 = uStack_ed0;
        local_e88 = uVar13;
        uStack_e80 = uVar14;
        local_e58 = uVar11;
        uStack_e50 = uVar12;
        local_e48 = local_e78;
        uStack_e40 = uStack_e70;
        local_e28 = local_e68;
        uStack_e20 = uStack_e60;
        local_e18 = uVar11;
        uStack_e10 = uVar12;
        local_de8 = uVar9;
        uStack_de0 = uVar10;
        local_dd8 = local_e08;
        uStack_dd0 = uStack_e00;
        local_db8 = local_df8;
        uStack_db0 = uStack_df0;
        local_da8 = uVar9;
        uStack_da0 = uVar10;
        local_d78 = uVar7;
        uStack_d70 = uVar8;
        local_d68 = local_d98;
        uStack_d60 = uStack_d90;
        local_d48 = local_d88;
        uStack_d40 = uStack_d80;
        local_d38 = uVar7;
        uStack_d30 = uVar8;
        local_d08 = uVar5;
        uStack_d00 = uVar6;
        local_cf8 = local_d28;
        uStack_cf0 = uStack_d20;
        local_cd8 = local_d18;
        uStack_cd0 = uStack_d10;
        local_cc8 = uVar5;
        uStack_cc0 = uVar6;
        local_c98 = uVar3;
        uStack_c90 = uVar4;
        local_c88 = local_cb8;
        uStack_c80 = uStack_cb0;
        local_c68 = local_ca8;
        uStack_c60 = uStack_ca0;
        local_c58 = uVar3;
        uStack_c50 = uVar4;
        local_c28 = uVar1;
        uStack_c20 = uVar2;
        local_bf8 = local_c38;
        uStack_bf0 = uStack_c30;
        local_be8 = uVar1;
        uStack_be0 = uVar2;
        local_bc8 = local_ed8;
        uStack_bc0 = uStack_ed0;
        local_bb8 = uVar17;
        uStack_bb0 = uVar18;
        local_ba8 = local_bd8;
        uStack_ba0 = uStack_bd0;
        local_b88 = local_ed8;
        uStack_b80 = uStack_ed0;
        local_b78 = uVar17;
        uStack_b70 = uVar18;
        local_b48 = uVar15;
        uStack_b40 = uVar16;
        local_b38 = local_b68;
        uStack_b30 = uStack_b60;
        local_b18 = local_b58;
        uStack_b10 = uStack_b50;
        local_b08 = uVar15;
        uStack_b00 = uVar16;
        local_ad8 = uVar13;
        uStack_ad0 = uVar14;
        local_ac8 = local_af8;
        uStack_ac0 = uStack_af0;
        local_aa8 = local_ae8;
        uStack_aa0 = uStack_ae0;
        local_a98 = uVar13;
        uStack_a90 = uVar14;
        local_a78 = local_d88;
        uStack_a70 = uStack_d80;
        local_a68 = uVar11;
        uStack_a60 = uVar12;
        local_a58 = local_a88;
        uStack_a50 = uStack_a80;
        local_a38 = local_d88;
        uStack_a30 = uStack_d80;
        local_a28 = uVar11;
        uStack_a20 = uVar12;
        local_9f8 = uVar9;
        uStack_9f0 = uVar10;
        local_9e8 = local_a18;
        uStack_9e0 = uStack_a10;
        local_9c8 = local_a08;
        uStack_9c0 = uStack_a00;
        local_9b8 = uVar9;
        uStack_9b0 = uVar10;
        local_988 = uVar7;
        uStack_980 = uVar8;
        local_978 = local_9a8;
        uStack_970 = uStack_9a0;
        local_958 = local_998;
        uStack_950 = uStack_990;
        local_948 = uVar7;
        uStack_940 = uVar8;
        local_928 = local_c38;
        uStack_920 = uStack_c30;
        local_918 = uVar5;
        uStack_910 = uVar6;
        local_908 = local_938;
        uStack_900 = uStack_930;
        local_8e8 = local_c38;
        uStack_8e0 = uStack_c30;
        local_8d8 = uVar5;
        uStack_8d0 = uVar6;
        local_8a8 = uVar3;
        uStack_8a0 = uVar4;
        local_898 = local_8c8;
        uStack_890 = uStack_8c0;
        local_878 = local_8b8;
        uStack_870 = uStack_8b0;
        local_868 = uVar3;
        uStack_860 = uVar4;
        local_838 = uVar1;
        uStack_830 = uVar2;
        local_808 = local_848;
        uStack_800 = uStack_840;
        local_7f8 = uVar1;
        uStack_7f0 = uVar2;
        local_7d8 = local_ae8;
        uStack_7d0 = uStack_ae0;
        local_7c8 = uVar17;
        uStack_7c0 = uVar18;
        local_7b8 = local_7e8;
        uStack_7b0 = uStack_7e0;
        local_798 = local_ae8;
        uStack_790 = uStack_ae0;
        local_788 = uVar17;
        uStack_780 = uVar18;
        local_758 = uVar15;
        uStack_750 = uVar16;
        local_748 = local_778;
        uStack_740 = uStack_770;
        local_728 = local_768;
        uStack_720 = uStack_760;
        local_718 = uVar15;
        uStack_710 = uVar16;
        local_6e8 = uVar13;
        uStack_6e0 = uVar14;
        local_6d8 = local_708;
        uStack_6d0 = uStack_700;
        local_6b8 = local_6f8;
        uStack_6b0 = uStack_6f0;
        local_6a8 = uVar13;
        uStack_6a0 = uVar14;
        local_688 = local_998;
        uStack_680 = uStack_990;
        local_678 = uVar11;
        uStack_670 = uVar12;
        local_668 = local_698;
        uStack_660 = uStack_690;
        local_648 = local_998;
        uStack_640 = uStack_990;
        local_638 = uVar11;
        uStack_630 = uVar12;
        local_608 = uVar9;
        uStack_600 = uVar10;
        local_5f8 = local_628;
        uStack_5f0 = uStack_620;
        local_5d8 = local_618;
        uStack_5d0 = uStack_610;
        local_5c8 = uVar9;
        uStack_5c0 = uVar10;
        local_598 = uVar7;
        uStack_590 = uVar8;
        local_588 = local_5b8;
        uStack_580 = uStack_5b0;
        local_568 = local_5a8;
        uStack_560 = uStack_5a0;
        local_558 = uVar7;
        uStack_550 = uVar8;
        local_538 = local_848;
        uStack_530 = uStack_840;
        local_528 = uVar5;
        uStack_520 = uVar6;
        local_518 = local_548;
        uStack_510 = uStack_540;
        local_4f8 = local_848;
        uStack_4f0 = uStack_840;
        local_4e8 = uVar5;
        uStack_4e0 = uVar6;
        local_4b8 = uVar3;
        uStack_4b0 = uVar4;
        local_4a8 = local_4d8;
        uStack_4a0 = uStack_4d0;
        local_488 = local_4c8;
        uStack_480 = uStack_4c0;
        local_478 = uVar3;
        uStack_470 = uVar4;
        local_448 = uVar1;
        uStack_440 = uVar2;
        local_418 = local_458;
        uStack_410 = uStack_450;
        local_408 = uVar1;
        uStack_400 = uVar2;
        local_3e8 = local_6f8;
        uStack_3e0 = uStack_6f0;
        local_3d8 = uVar17;
        uStack_3d0 = uVar18;
        local_3c8 = local_3f8;
        uStack_3c0 = uStack_3f0;
        local_3a8 = local_6f8;
        uStack_3a0 = uStack_6f0;
        local_398 = uVar17;
        uStack_390 = uVar18;
        local_368 = uVar15;
        uStack_360 = uVar16;
        local_358 = local_388;
        uStack_350 = uStack_380;
        local_338 = local_378;
        uStack_330 = uStack_370;
        local_328 = uVar15;
        uStack_320 = uVar16;
        local_2f8 = uVar13;
        uStack_2f0 = uVar14;
        local_2e8 = local_318;
        uStack_2e0 = uStack_310;
        local_2c8 = local_308;
        uStack_2c0 = uStack_300;
        local_2b8 = uVar13;
        uStack_2b0 = uVar14;
        local_298 = local_5a8;
        uStack_290 = uStack_5a0;
        local_288 = uVar11;
        uStack_280 = uVar12;
        local_278 = local_2a8;
        uStack_270 = uStack_2a0;
        local_258 = local_5a8;
        uStack_250 = uStack_5a0;
        local_248 = uVar11;
        uStack_240 = uVar12;
        local_218 = uVar9;
        uStack_210 = uVar10;
        local_208 = local_238;
        uStack_200 = uStack_230;
        local_1e8 = local_228;
        uStack_1e0 = uStack_220;
        local_1d8 = uVar9;
        uStack_1d0 = uVar10;
        local_1a8 = uVar7;
        uStack_1a0 = uVar8;
        local_198 = local_1c8;
        uStack_190 = uStack_1c0;
        local_178 = local_1b8;
        uStack_170 = uStack_1b0;
        local_168 = uVar7;
        uStack_160 = uVar8;
        local_148 = local_458;
        uStack_140 = uStack_450;
        local_138 = uVar5;
        uStack_130 = uVar6;
        local_128 = local_158;
        uStack_120 = uStack_150;
        local_108 = local_458;
        uStack_100 = uStack_450;
        local_f8 = uVar5;
        uStack_f0 = uVar6;
        local_c8 = uVar3;
        uStack_c0 = uVar4;
        local_b8 = local_e8;
        uStack_b0 = uStack_e0;
        local_98 = local_d8;
        uStack_90 = uStack_d0;
        local_88 = uVar3;
        uStack_80 = uVar4;
        local_58 = uVar1;
        uStack_50 = uVar2;
        local_48 = local_1f28;
        uStack_40 = uStack_1f20;
        local_28 = local_68;
        uStack_20 = uStack_60;
        local_18 = uVar1;
        uStack_10 = uVar2;
      }
      for (; local_2040 + 1 < local_1ea8; local_2040 = local_2040 + 2) {
        local_1da8 = local_1f98;
        local_1028 = *(undefined8 *)local_1f98;
        uStack_1020 = *(undefined8 *)(local_1f98 + 2);
        local_1db0 = local_1f98 + 4;
        local_1098 = *(undefined8 *)local_1db0;
        uStack_1090 = *(undefined8 *)(local_1f98 + 6);
        local_1db8 = local_1f98 + 8;
        local_1418 = *(undefined8 *)local_1db8;
        uStack_1410 = *(undefined8 *)(local_1f98 + 10);
        local_1dc0 = local_1fa0;
        local_1178 = *(undefined8 *)local_1fa0;
        uStack_1170 = *(undefined8 *)(local_1fa0 + 2);
        local_1dc8 = local_1fa0 + 4;
        local_11e8 = *(undefined8 *)local_1dc8;
        uStack_11e0 = *(undefined8 *)(local_1fa0 + 6);
        local_1dd0 = local_1fa0 + 8;
        local_1568 = *(undefined8 *)local_1dd0;
        uStack_1560 = *(undefined8 *)(local_1fa0 + 10);
        local_1dd8 = local_1fa8;
        local_12c8 = *(undefined8 *)local_1fa8;
        uStack_12c0 = *(undefined8 *)(local_1fa8 + 2);
        local_1de0 = local_1fa8 + 4;
        local_1338 = *(undefined8 *)local_1de0;
        uStack_1330 = *(undefined8 *)(local_1fa8 + 6);
        local_1de8 = local_1fa8 + 8;
        local_16b8 = *(undefined8 *)local_1de8;
        uStack_16b0 = *(undefined8 *)(local_1fa8 + 10);
        local_1038 = local_1f28;
        uStack_1030 = uStack_1f20;
        local_fe8._0_4_ = (float)local_1028;
        local_fe8._4_4_ = (float)((ulong)local_1028 >> 0x20);
        uStack_fe0._0_4_ = (float)uStack_1020;
        uStack_fe0._4_4_ = (float)((ulong)uStack_1020 >> 0x20);
        local_ff8 = (float)local_18 * (float)local_fe8;
        fStack_ff4 = local_18._4_4_ * local_fe8._4_4_;
        fStack_ff0 = (float)uStack_10 * (float)uStack_fe0;
        fStack_fec = uStack_10._4_4_ * uStack_fe0._4_4_;
        local_1008 = local_1f28;
        uStack_1000 = uStack_1f20;
        local_10a8 = CONCAT44(fStack_ff4 + local_48._4_4_,local_ff8 + (float)local_48);
        uStack_10a0 = CONCAT44(fStack_fec + uStack_40._4_4_,fStack_ff0 + (float)uStack_40);
        local_1058._0_4_ = (float)local_1098;
        local_1058._4_4_ = (float)((ulong)local_1098 >> 0x20);
        uStack_1050._0_4_ = (float)uStack_1090;
        uStack_1050._4_4_ = (float)((ulong)uStack_1090 >> 0x20);
        local_1068 = (float)local_88 * (float)local_1058;
        fStack_1064 = local_88._4_4_ * local_1058._4_4_;
        fStack_1060 = (float)uStack_80 * (float)uStack_1050;
        fStack_105c = uStack_80._4_4_ * uStack_1050._4_4_;
        fVar39 = local_1068 + local_ff8 + (float)local_48;
        fVar40 = fStack_1064 + fStack_ff4 + local_48._4_4_;
        fVar41 = fStack_1060 + fStack_ff0 + (float)uStack_40;
        fVar42 = fStack_105c + fStack_fec + uStack_40._4_4_;
        local_1118 = CONCAT44(fVar40,fVar39);
        uStack_1110 = CONCAT44(fVar42,fVar41);
        local_10c8._0_4_ = (float)local_1418;
        local_10c8._4_4_ = (float)((ulong)local_1418 >> 0x20);
        uStack_10c0._0_4_ = (float)uStack_1410;
        uStack_10c0._4_4_ = (float)((ulong)uStack_1410 >> 0x20);
        local_10d8 = (float)local_f8 * (float)local_10c8;
        fStack_10d4 = local_f8._4_4_ * local_10c8._4_4_;
        fStack_10d0 = (float)uStack_f0 * (float)uStack_10c0;
        fStack_10cc = uStack_f0._4_4_ * uStack_10c0._4_4_;
        fVar39 = local_10d8 + fVar39;
        fVar40 = fStack_10d4 + fVar40;
        fVar41 = fStack_10d0 + fVar41;
        fVar42 = fStack_10cc + fVar42;
        local_1188 = CONCAT44(fVar40,fVar39);
        uStack_1180 = CONCAT44(fVar42,fVar41);
        local_1138._0_4_ = (float)local_1178;
        local_1138._4_4_ = (float)((ulong)local_1178 >> 0x20);
        uStack_1130._0_4_ = (float)uStack_1170;
        uStack_1130._4_4_ = (float)((ulong)uStack_1170 >> 0x20);
        local_1148 = (float)local_168 * (float)local_1138;
        fStack_1144 = local_168._4_4_ * local_1138._4_4_;
        fStack_1140 = (float)uStack_160 * (float)uStack_1130;
        fStack_113c = uStack_160._4_4_ * uStack_1130._4_4_;
        fVar39 = local_1148 + fVar39;
        fVar40 = fStack_1144 + fVar40;
        fVar41 = fStack_1140 + fVar41;
        fVar42 = fStack_113c + fVar42;
        local_11f8 = CONCAT44(fVar40,fVar39);
        uStack_11f0 = CONCAT44(fVar42,fVar41);
        local_11a8._0_4_ = (float)local_11e8;
        local_11a8._4_4_ = (float)((ulong)local_11e8 >> 0x20);
        uStack_11a0._0_4_ = (float)uStack_11e0;
        uStack_11a0._4_4_ = (float)((ulong)uStack_11e0 >> 0x20);
        local_11b8 = (float)local_1d8 * (float)local_11a8;
        fStack_11b4 = local_1d8._4_4_ * local_11a8._4_4_;
        fStack_11b0 = (float)uStack_1d0 * (float)uStack_11a0;
        fStack_11ac = uStack_1d0._4_4_ * uStack_11a0._4_4_;
        fVar39 = local_11b8 + fVar39;
        fVar40 = fStack_11b4 + fVar40;
        fVar41 = fStack_11b0 + fVar41;
        fVar42 = fStack_11ac + fVar42;
        local_1268 = CONCAT44(fVar40,fVar39);
        uStack_1260 = CONCAT44(fVar42,fVar41);
        local_1218._0_4_ = (float)local_1568;
        local_1218._4_4_ = (float)((ulong)local_1568 >> 0x20);
        uStack_1210._0_4_ = (float)uStack_1560;
        uStack_1210._4_4_ = (float)((ulong)uStack_1560 >> 0x20);
        local_1228 = (float)local_248 * (float)local_1218;
        fStack_1224 = local_248._4_4_ * local_1218._4_4_;
        fStack_1220 = (float)uStack_240 * (float)uStack_1210;
        fStack_121c = uStack_240._4_4_ * uStack_1210._4_4_;
        fVar39 = local_1228 + fVar39;
        fVar40 = fStack_1224 + fVar40;
        fVar41 = fStack_1220 + fVar41;
        fVar42 = fStack_121c + fVar42;
        local_12d8 = CONCAT44(fVar40,fVar39);
        uStack_12d0 = CONCAT44(fVar42,fVar41);
        local_1288._0_4_ = (float)local_12c8;
        local_1288._4_4_ = (float)((ulong)local_12c8 >> 0x20);
        uStack_1280._0_4_ = (float)uStack_12c0;
        uStack_1280._4_4_ = (float)((ulong)uStack_12c0 >> 0x20);
        local_1298 = (float)local_2b8 * (float)local_1288;
        fStack_1294 = local_2b8._4_4_ * local_1288._4_4_;
        fStack_1290 = (float)uStack_2b0 * (float)uStack_1280;
        fStack_128c = uStack_2b0._4_4_ * uStack_1280._4_4_;
        fVar39 = local_1298 + fVar39;
        fVar40 = fStack_1294 + fVar40;
        fVar41 = fStack_1290 + fVar41;
        fVar42 = fStack_128c + fVar42;
        local_1348 = CONCAT44(fVar40,fVar39);
        uStack_1340 = CONCAT44(fVar42,fVar41);
        local_12f8._0_4_ = (float)local_1338;
        local_12f8._4_4_ = (float)((ulong)local_1338 >> 0x20);
        uStack_12f0._0_4_ = (float)uStack_1330;
        uStack_12f0._4_4_ = (float)((ulong)uStack_1330 >> 0x20);
        local_1308 = (float)local_328 * (float)local_12f8;
        fStack_1304 = local_328._4_4_ * local_12f8._4_4_;
        fStack_1300 = (float)uStack_320 * (float)uStack_12f0;
        fStack_12fc = uStack_320._4_4_ * uStack_12f0._4_4_;
        fVar39 = local_1308 + fVar39;
        fVar40 = fStack_1304 + fVar40;
        fVar41 = fStack_1300 + fVar41;
        fVar42 = fStack_12fc + fVar42;
        local_13b8 = CONCAT44(fVar40,fVar39);
        uStack_13b0 = CONCAT44(fVar42,fVar41);
        local_1368._0_4_ = (float)local_16b8;
        local_1368._4_4_ = (float)((ulong)local_16b8 >> 0x20);
        uStack_1360._0_4_ = (float)uStack_16b0;
        uStack_1360._4_4_ = (float)((ulong)uStack_16b0 >> 0x20);
        local_1378 = (float)local_398 * (float)local_1368;
        fStack_1374 = local_398._4_4_ * local_1368._4_4_;
        fStack_1370 = (float)uStack_390 * (float)uStack_1360;
        fStack_136c = uStack_390._4_4_ * uStack_1360._4_4_;
        local_1c38 = CONCAT44(fStack_1374 + fVar40,local_1378 + fVar39);
        uStack_1c30 = CONCAT44(fStack_136c + fVar42,fStack_1370 + fVar41);
        local_1df0 = local_1f98 + 0xc;
        local_1488 = *(undefined8 *)local_1df0;
        uStack_1480 = *(undefined8 *)(local_1f98 + 0xe);
        local_1df8 = local_1fa0 + 0xc;
        local_15d8 = *(undefined8 *)local_1df8;
        uStack_15d0 = *(undefined8 *)(local_1fa0 + 0xe);
        local_1e00 = local_1fa8 + 0xc;
        local_1728 = *(undefined8 *)local_1e00;
        uStack_1720 = *(undefined8 *)(local_1fa8 + 0xe);
        local_1e08 = local_1f98 + 0x10;
        local_14f8 = *(undefined8 *)local_1e08;
        uStack_14f0 = *(undefined8 *)(local_1f98 + 0x12);
        local_1e10 = local_1fa0 + 0x10;
        local_1648 = *(undefined8 *)local_1e10;
        uStack_1640 = *(undefined8 *)(local_1fa0 + 0x12);
        local_1e18 = local_1fa8 + 0x10;
        local_1798 = *(undefined8 *)local_1e18;
        uStack_1790 = *(undefined8 *)(local_1fa8 + 0x12);
        local_1c20 = local_1f48;
        *(undefined8 *)local_1f48 = local_1c38;
        *(undefined8 *)(local_1f48 + 2) = uStack_1c30;
        local_1428 = local_1f28;
        uStack_1420 = uStack_1f20;
        local_13e8 = (float)local_18 * (float)local_10c8;
        fStack_13e4 = local_18._4_4_ * local_10c8._4_4_;
        fStack_13e0 = (float)uStack_10 * (float)uStack_10c0;
        fStack_13dc = uStack_10._4_4_ * uStack_10c0._4_4_;
        local_13f8 = local_1f28;
        uStack_13f0 = uStack_1f20;
        local_1498 = CONCAT44(fStack_13e4 + local_48._4_4_,local_13e8 + (float)local_48);
        uStack_1490 = CONCAT44(fStack_13dc + uStack_40._4_4_,fStack_13e0 + (float)uStack_40);
        local_1448._0_4_ = (float)local_1488;
        local_1448._4_4_ = (float)((ulong)local_1488 >> 0x20);
        uStack_1440._0_4_ = (float)uStack_1480;
        uStack_1440._4_4_ = (float)((ulong)uStack_1480 >> 0x20);
        local_1458 = (float)local_88 * (float)local_1448;
        fStack_1454 = local_88._4_4_ * local_1448._4_4_;
        fStack_1450 = (float)uStack_80 * (float)uStack_1440;
        fStack_144c = uStack_80._4_4_ * uStack_1440._4_4_;
        fVar39 = local_1458 + local_13e8 + (float)local_48;
        fVar40 = fStack_1454 + fStack_13e4 + local_48._4_4_;
        fVar41 = fStack_1450 + fStack_13e0 + (float)uStack_40;
        fVar42 = fStack_144c + fStack_13dc + uStack_40._4_4_;
        local_1508 = CONCAT44(fVar40,fVar39);
        uStack_1500 = CONCAT44(fVar42,fVar41);
        local_14b8._0_4_ = (float)local_14f8;
        local_14b8._4_4_ = (float)((ulong)local_14f8 >> 0x20);
        uStack_14b0._0_4_ = (float)uStack_14f0;
        uStack_14b0._4_4_ = (float)((ulong)uStack_14f0 >> 0x20);
        local_14c8 = (float)local_f8 * (float)local_14b8;
        fStack_14c4 = local_f8._4_4_ * local_14b8._4_4_;
        fStack_14c0 = (float)uStack_f0 * (float)uStack_14b0;
        fStack_14bc = uStack_f0._4_4_ * uStack_14b0._4_4_;
        fVar39 = local_14c8 + fVar39;
        fVar40 = fStack_14c4 + fVar40;
        fVar41 = fStack_14c0 + fVar41;
        fVar42 = fStack_14bc + fVar42;
        local_1578 = CONCAT44(fVar40,fVar39);
        uStack_1570 = CONCAT44(fVar42,fVar41);
        local_1538 = (float)local_168 * (float)local_1218;
        fStack_1534 = local_168._4_4_ * local_1218._4_4_;
        fStack_1530 = (float)uStack_160 * (float)uStack_1210;
        fStack_152c = uStack_160._4_4_ * uStack_1210._4_4_;
        fVar39 = local_1538 + fVar39;
        fVar40 = fStack_1534 + fVar40;
        fVar41 = fStack_1530 + fVar41;
        fVar42 = fStack_152c + fVar42;
        local_15e8 = CONCAT44(fVar40,fVar39);
        uStack_15e0 = CONCAT44(fVar42,fVar41);
        local_1598._0_4_ = (float)local_15d8;
        local_1598._4_4_ = (float)((ulong)local_15d8 >> 0x20);
        uStack_1590._0_4_ = (float)uStack_15d0;
        uStack_1590._4_4_ = (float)((ulong)uStack_15d0 >> 0x20);
        local_15a8 = (float)local_1d8 * (float)local_1598;
        fStack_15a4 = local_1d8._4_4_ * local_1598._4_4_;
        fStack_15a0 = (float)uStack_1d0 * (float)uStack_1590;
        fStack_159c = uStack_1d0._4_4_ * uStack_1590._4_4_;
        fVar39 = local_15a8 + fVar39;
        fVar40 = fStack_15a4 + fVar40;
        fVar41 = fStack_15a0 + fVar41;
        fVar42 = fStack_159c + fVar42;
        local_1658 = CONCAT44(fVar40,fVar39);
        uStack_1650 = CONCAT44(fVar42,fVar41);
        local_1608._0_4_ = (float)local_1648;
        local_1608._4_4_ = (float)((ulong)local_1648 >> 0x20);
        uStack_1600._0_4_ = (float)uStack_1640;
        uStack_1600._4_4_ = (float)((ulong)uStack_1640 >> 0x20);
        local_1618 = (float)local_248 * (float)local_1608;
        fStack_1614 = local_248._4_4_ * local_1608._4_4_;
        fStack_1610 = (float)uStack_240 * (float)uStack_1600;
        fStack_160c = uStack_240._4_4_ * uStack_1600._4_4_;
        fVar39 = local_1618 + fVar39;
        fVar40 = fStack_1614 + fVar40;
        fVar41 = fStack_1610 + fVar41;
        fVar42 = fStack_160c + fVar42;
        local_16c8 = CONCAT44(fVar40,fVar39);
        uStack_16c0 = CONCAT44(fVar42,fVar41);
        local_1688 = (float)local_2b8 * (float)local_1368;
        fStack_1684 = local_2b8._4_4_ * local_1368._4_4_;
        fStack_1680 = (float)uStack_2b0 * (float)uStack_1360;
        fStack_167c = uStack_2b0._4_4_ * uStack_1360._4_4_;
        fVar39 = local_1688 + fVar39;
        fVar40 = fStack_1684 + fVar40;
        fVar41 = fStack_1680 + fVar41;
        fVar42 = fStack_167c + fVar42;
        local_1738 = CONCAT44(fVar40,fVar39);
        uStack_1730 = CONCAT44(fVar42,fVar41);
        local_16e8._0_4_ = (float)local_1728;
        local_16e8._4_4_ = (float)((ulong)local_1728 >> 0x20);
        uStack_16e0._0_4_ = (float)uStack_1720;
        uStack_16e0._4_4_ = (float)((ulong)uStack_1720 >> 0x20);
        local_16f8 = (float)local_328 * (float)local_16e8;
        fStack_16f4 = local_328._4_4_ * local_16e8._4_4_;
        fStack_16f0 = (float)uStack_320 * (float)uStack_16e0;
        fStack_16ec = uStack_320._4_4_ * uStack_16e0._4_4_;
        fVar39 = local_16f8 + fVar39;
        fVar40 = fStack_16f4 + fVar40;
        fVar41 = fStack_16f0 + fVar41;
        fVar42 = fStack_16ec + fVar42;
        local_17a8 = CONCAT44(fVar40,fVar39);
        uStack_17a0 = CONCAT44(fVar42,fVar41);
        local_1758._0_4_ = (float)local_1798;
        local_1758._4_4_ = (float)((ulong)local_1798 >> 0x20);
        uStack_1750._0_4_ = (float)uStack_1790;
        uStack_1750._4_4_ = (float)((ulong)uStack_1790 >> 0x20);
        local_1768 = (float)local_398 * (float)local_1758;
        fStack_1764 = local_398._4_4_ * local_1758._4_4_;
        fStack_1760 = (float)uStack_390 * (float)uStack_1750;
        fStack_175c = uStack_390._4_4_ * uStack_1750._4_4_;
        local_1c58 = CONCAT44(fStack_1764 + fVar40,local_1768 + fVar39);
        uStack_1c50 = CONCAT44(fStack_175c + fVar42,fStack_1760 + fVar41);
        local_1c40 = local_1f48 + 4;
        *(undefined8 *)local_1c40 = local_1c58;
        *(undefined8 *)(local_1f48 + 6) = uStack_1c50;
        local_1f98 = local_1f98 + 0x10;
        local_1fa0 = local_1fa0 + 0x10;
        local_1fa8 = local_1fa8 + 0x10;
        local_1f48 = local_1f48 + 8;
        local_1788 = uVar17;
        uStack_1780 = uVar18;
        local_1778 = local_17a8;
        uStack_1770 = uStack_17a0;
        local_1758 = local_1798;
        uStack_1750 = uStack_1790;
        local_1748 = uVar17;
        uStack_1740 = uVar18;
        local_1718 = uVar15;
        uStack_1710 = uVar16;
        local_1708 = local_1738;
        uStack_1700 = uStack_1730;
        local_16e8 = local_1728;
        uStack_16e0 = uStack_1720;
        local_16d8 = uVar15;
        uStack_16d0 = uVar16;
        local_16a8 = uVar13;
        uStack_16a0 = uVar14;
        local_1698 = local_16c8;
        uStack_1690 = uStack_16c0;
        local_1678 = local_16b8;
        uStack_1670 = uStack_16b0;
        local_1668 = uVar13;
        uStack_1660 = uVar14;
        local_1638 = uVar11;
        uStack_1630 = uVar12;
        local_1628 = local_1658;
        uStack_1620 = uStack_1650;
        local_1608 = local_1648;
        uStack_1600 = uStack_1640;
        local_15f8 = uVar11;
        uStack_15f0 = uVar12;
        local_15c8 = uVar9;
        uStack_15c0 = uVar10;
        local_15b8 = local_15e8;
        uStack_15b0 = uStack_15e0;
        local_1598 = local_15d8;
        uStack_1590 = uStack_15d0;
        local_1588 = uVar9;
        uStack_1580 = uVar10;
        local_1558 = uVar7;
        uStack_1550 = uVar8;
        local_1548 = local_1578;
        uStack_1540 = uStack_1570;
        local_1528 = local_1568;
        uStack_1520 = uStack_1560;
        local_1518 = uVar7;
        uStack_1510 = uVar8;
        local_14e8 = uVar5;
        uStack_14e0 = uVar6;
        local_14d8 = local_1508;
        uStack_14d0 = uStack_1500;
        local_14b8 = local_14f8;
        uStack_14b0 = uStack_14f0;
        local_14a8 = uVar5;
        uStack_14a0 = uVar6;
        local_1478 = uVar3;
        uStack_1470 = uVar4;
        local_1468 = local_1498;
        uStack_1460 = uStack_1490;
        local_1448 = local_1488;
        uStack_1440 = uStack_1480;
        local_1438 = uVar3;
        uStack_1430 = uVar4;
        local_1408 = uVar1;
        uStack_1400 = uVar2;
        local_13d8 = local_1418;
        uStack_13d0 = uStack_1410;
        local_13c8 = uVar1;
        uStack_13c0 = uVar2;
        local_13a8 = local_16b8;
        uStack_13a0 = uStack_16b0;
        local_1398 = uVar17;
        uStack_1390 = uVar18;
        local_1388 = local_13b8;
        uStack_1380 = uStack_13b0;
        local_1368 = local_16b8;
        uStack_1360 = uStack_16b0;
        local_1358 = uVar17;
        uStack_1350 = uVar18;
        local_1328 = uVar15;
        uStack_1320 = uVar16;
        local_1318 = local_1348;
        uStack_1310 = uStack_1340;
        local_12f8 = local_1338;
        uStack_12f0 = uStack_1330;
        local_12e8 = uVar15;
        uStack_12e0 = uVar16;
        local_12b8 = uVar13;
        uStack_12b0 = uVar14;
        local_12a8 = local_12d8;
        uStack_12a0 = uStack_12d0;
        local_1288 = local_12c8;
        uStack_1280 = uStack_12c0;
        local_1278 = uVar13;
        uStack_1270 = uVar14;
        local_1258 = local_1568;
        uStack_1250 = uStack_1560;
        local_1248 = uVar11;
        uStack_1240 = uVar12;
        local_1238 = local_1268;
        uStack_1230 = uStack_1260;
        local_1218 = local_1568;
        uStack_1210 = uStack_1560;
        local_1208 = uVar11;
        uStack_1200 = uVar12;
        local_11d8 = uVar9;
        uStack_11d0 = uVar10;
        local_11c8 = local_11f8;
        uStack_11c0 = uStack_11f0;
        local_11a8 = local_11e8;
        uStack_11a0 = uStack_11e0;
        local_1198 = uVar9;
        uStack_1190 = uVar10;
        local_1168 = uVar7;
        uStack_1160 = uVar8;
        local_1158 = local_1188;
        uStack_1150 = uStack_1180;
        local_1138 = local_1178;
        uStack_1130 = uStack_1170;
        local_1128 = uVar7;
        uStack_1120 = uVar8;
        local_1108 = local_1418;
        uStack_1100 = uStack_1410;
        local_10f8 = uVar5;
        uStack_10f0 = uVar6;
        local_10e8 = local_1118;
        uStack_10e0 = uStack_1110;
        local_10c8 = local_1418;
        uStack_10c0 = uStack_1410;
        local_10b8 = uVar5;
        uStack_10b0 = uVar6;
        local_1088 = uVar3;
        uStack_1080 = uVar4;
        local_1078 = local_10a8;
        uStack_1070 = uStack_10a0;
        local_1058 = local_1098;
        uStack_1050 = uStack_1090;
        local_1048 = uVar3;
        uStack_1040 = uVar4;
        local_1018 = uVar1;
        uStack_1010 = uVar2;
        local_fe8 = local_1028;
        uStack_fe0 = uStack_1020;
        local_fd8 = uVar1;
        uStack_fd0 = uVar2;
      }
      for (; local_2040 < local_1ea8; local_2040 = local_2040 + 1) {
        local_1e20 = local_1f98;
        local_1808 = *(undefined8 *)local_1f98;
        uStack_1800 = *(undefined8 *)(local_1f98 + 2);
        local_1e28 = local_1f98 + 4;
        local_1878 = *(undefined8 *)local_1e28;
        uStack_1870 = *(undefined8 *)(local_1f98 + 6);
        local_1e30 = local_1f98 + 8;
        local_18e8 = *(undefined8 *)local_1e30;
        uStack_18e0 = *(undefined8 *)(local_1f98 + 10);
        local_1e38 = local_1fa0;
        local_1958 = *(undefined8 *)local_1fa0;
        uStack_1950 = *(undefined8 *)(local_1fa0 + 2);
        local_1e40 = local_1fa0 + 4;
        local_19c8 = *(undefined8 *)local_1e40;
        uStack_19c0 = *(undefined8 *)(local_1fa0 + 6);
        local_1e48 = local_1fa0 + 8;
        local_1a38 = *(undefined8 *)local_1e48;
        uStack_1a30 = *(undefined8 *)(local_1fa0 + 10);
        local_1e50 = local_1fa8;
        local_1aa8 = *(undefined8 *)local_1fa8;
        uStack_1aa0 = *(undefined8 *)(local_1fa8 + 2);
        local_1e58 = local_1fa8 + 4;
        local_1b18 = *(undefined8 *)local_1e58;
        uStack_1b10 = *(undefined8 *)(local_1fa8 + 6);
        pfStack_1e60 = local_1fa8 + 8;
        local_1b88 = *(undefined8 *)pfStack_1e60;
        uStack_1b80 = *(undefined8 *)(local_1fa8 + 10);
        local_1818 = local_1f28;
        uStack_1810 = uStack_1f20;
        local_17c8._0_4_ = (float)local_1808;
        local_17c8._4_4_ = (float)((ulong)local_1808 >> 0x20);
        uStack_17c0._0_4_ = (float)uStack_1800;
        uStack_17c0._4_4_ = (float)((ulong)uStack_1800 >> 0x20);
        local_17d8 = (float)local_18 * (float)local_17c8;
        fStack_17d4 = local_18._4_4_ * local_17c8._4_4_;
        fStack_17d0 = (float)uStack_10 * (float)uStack_17c0;
        fStack_17cc = uStack_10._4_4_ * uStack_17c0._4_4_;
        local_17e8 = local_1f28;
        uStack_17e0 = uStack_1f20;
        local_1888 = CONCAT44(fStack_17d4 + local_48._4_4_,local_17d8 + (float)local_48);
        uStack_1880 = CONCAT44(fStack_17cc + uStack_40._4_4_,fStack_17d0 + (float)uStack_40);
        local_1838._0_4_ = (float)local_1878;
        local_1838._4_4_ = (float)((ulong)local_1878 >> 0x20);
        uStack_1830._0_4_ = (float)uStack_1870;
        uStack_1830._4_4_ = (float)((ulong)uStack_1870 >> 0x20);
        local_1848 = (float)local_88 * (float)local_1838;
        fStack_1844 = local_88._4_4_ * local_1838._4_4_;
        fStack_1840 = (float)uStack_80 * (float)uStack_1830;
        fStack_183c = uStack_80._4_4_ * uStack_1830._4_4_;
        in_stack_ffffffffffffd448 = local_1848 + local_17d8 + (float)local_48;
        in_stack_ffffffffffffd44c = fStack_1844 + fStack_17d4 + local_48._4_4_;
        fVar41 = fStack_1840 + fStack_17d0 + (float)uStack_40;
        in_stack_ffffffffffffd444 = fStack_183c + fStack_17cc + uStack_40._4_4_;
        local_18f8 = CONCAT44(in_stack_ffffffffffffd44c,in_stack_ffffffffffffd448);
        uStack_18f0 = CONCAT44(in_stack_ffffffffffffd444,fVar41);
        local_18a8._0_4_ = (float)local_18e8;
        local_18a8._4_4_ = (float)((ulong)local_18e8 >> 0x20);
        uStack_18a0._0_4_ = (float)uStack_18e0;
        uStack_18a0._4_4_ = (float)((ulong)uStack_18e0 >> 0x20);
        local_18b8 = (float)local_f8 * (float)local_18a8;
        fStack_18b4 = local_f8._4_4_ * local_18a8._4_4_;
        fStack_18b0 = (float)uStack_f0 * (float)uStack_18a0;
        fStack_18ac = uStack_f0._4_4_ * uStack_18a0._4_4_;
        in_stack_ffffffffffffd448 = local_18b8 + in_stack_ffffffffffffd448;
        in_stack_ffffffffffffd44c = fStack_18b4 + in_stack_ffffffffffffd44c;
        fVar41 = fStack_18b0 + fVar41;
        in_stack_ffffffffffffd444 = fStack_18ac + in_stack_ffffffffffffd444;
        local_1968 = CONCAT44(in_stack_ffffffffffffd44c,in_stack_ffffffffffffd448);
        uStack_1960 = CONCAT44(in_stack_ffffffffffffd444,fVar41);
        local_1918._0_4_ = (float)local_1958;
        local_1918._4_4_ = (float)((ulong)local_1958 >> 0x20);
        uStack_1910._0_4_ = (float)uStack_1950;
        uStack_1910._4_4_ = (float)((ulong)uStack_1950 >> 0x20);
        local_1928 = (float)local_168 * (float)local_1918;
        fStack_1924 = local_168._4_4_ * local_1918._4_4_;
        fStack_1920 = (float)uStack_160 * (float)uStack_1910;
        fStack_191c = uStack_160._4_4_ * uStack_1910._4_4_;
        in_stack_ffffffffffffd448 = local_1928 + in_stack_ffffffffffffd448;
        in_stack_ffffffffffffd44c = fStack_1924 + in_stack_ffffffffffffd44c;
        fVar41 = fStack_1920 + fVar41;
        in_stack_ffffffffffffd444 = fStack_191c + in_stack_ffffffffffffd444;
        local_19d8 = CONCAT44(in_stack_ffffffffffffd44c,in_stack_ffffffffffffd448);
        uStack_19d0 = CONCAT44(in_stack_ffffffffffffd444,fVar41);
        local_1988._0_4_ = (float)local_19c8;
        local_1988._4_4_ = (float)((ulong)local_19c8 >> 0x20);
        uStack_1980._0_4_ = (float)uStack_19c0;
        uStack_1980._4_4_ = (float)((ulong)uStack_19c0 >> 0x20);
        local_1998 = (float)local_1d8 * (float)local_1988;
        fStack_1994 = local_1d8._4_4_ * local_1988._4_4_;
        fStack_1990 = (float)uStack_1d0 * (float)uStack_1980;
        fStack_198c = uStack_1d0._4_4_ * uStack_1980._4_4_;
        in_stack_ffffffffffffd448 = local_1998 + in_stack_ffffffffffffd448;
        in_stack_ffffffffffffd44c = fStack_1994 + in_stack_ffffffffffffd44c;
        fVar41 = fStack_1990 + fVar41;
        in_stack_ffffffffffffd444 = fStack_198c + in_stack_ffffffffffffd444;
        local_1a48 = CONCAT44(in_stack_ffffffffffffd44c,in_stack_ffffffffffffd448);
        uStack_1a40 = CONCAT44(in_stack_ffffffffffffd444,fVar41);
        local_19f8._0_4_ = (float)local_1a38;
        local_19f8._4_4_ = (float)((ulong)local_1a38 >> 0x20);
        uStack_19f0._0_4_ = (float)uStack_1a30;
        uStack_19f0._4_4_ = (float)((ulong)uStack_1a30 >> 0x20);
        local_1a08 = (float)local_248 * (float)local_19f8;
        fStack_1a04 = local_248._4_4_ * local_19f8._4_4_;
        fStack_1a00 = (float)uStack_240 * (float)uStack_19f0;
        fStack_19fc = uStack_240._4_4_ * uStack_19f0._4_4_;
        in_stack_ffffffffffffd448 = local_1a08 + in_stack_ffffffffffffd448;
        in_stack_ffffffffffffd44c = fStack_1a04 + in_stack_ffffffffffffd44c;
        fVar41 = fStack_1a00 + fVar41;
        in_stack_ffffffffffffd444 = fStack_19fc + in_stack_ffffffffffffd444;
        local_1ab8 = CONCAT44(in_stack_ffffffffffffd44c,in_stack_ffffffffffffd448);
        uStack_1ab0 = CONCAT44(in_stack_ffffffffffffd444,fVar41);
        local_1a68._0_4_ = (float)local_1aa8;
        local_1a68._4_4_ = (float)((ulong)local_1aa8 >> 0x20);
        uStack_1a60._0_4_ = (float)uStack_1aa0;
        uStack_1a60._4_4_ = (float)((ulong)uStack_1aa0 >> 0x20);
        local_1a78 = (float)local_2b8 * (float)local_1a68;
        fStack_1a74 = local_2b8._4_4_ * local_1a68._4_4_;
        fStack_1a70 = (float)uStack_2b0 * (float)uStack_1a60;
        fStack_1a6c = uStack_2b0._4_4_ * uStack_1a60._4_4_;
        fVar41 = fStack_1a70 + fVar41;
        in_stack_ffffffffffffd444 = fStack_1a6c + in_stack_ffffffffffffd444;
        local_1b28 = CONCAT44(fStack_1a74 + in_stack_ffffffffffffd44c,
                              local_1a78 + in_stack_ffffffffffffd448);
        uStack_1b20 = CONCAT44(in_stack_ffffffffffffd444,fVar41);
        local_1ad8._0_4_ = (float)local_1b18;
        local_1ad8._4_4_ = (float)((ulong)local_1b18 >> 0x20);
        uStack_1ad0._0_4_ = (float)uStack_1b10;
        uStack_1ad0._4_4_ = (float)((ulong)uStack_1b10 >> 0x20);
        local_1ae8 = (float)local_328 * (float)local_1ad8;
        fStack_1ae4 = local_328._4_4_ * local_1ad8._4_4_;
        fStack_1ae0 = (float)uStack_320 * (float)uStack_1ad0;
        fStack_1adc = uStack_320._4_4_ * uStack_1ad0._4_4_;
        fVar39 = local_1ae8 + local_1a78 + in_stack_ffffffffffffd448;
        fVar40 = fStack_1ae4 + fStack_1a74 + in_stack_ffffffffffffd44c;
        fVar41 = fStack_1ae0 + fVar41;
        local_1b98 = CONCAT44(fVar40,fVar39);
        uStack_1b90 = CONCAT44(fStack_1adc + in_stack_ffffffffffffd444,fVar41);
        local_1b48._0_4_ = (float)local_1b88;
        local_1b48._4_4_ = (float)((ulong)local_1b88 >> 0x20);
        uStack_1b40._0_4_ = (float)uStack_1b80;
        uStack_1b40._4_4_ = (float)((ulong)uStack_1b80 >> 0x20);
        local_1b58 = (float)local_398 * (float)local_1b48;
        fStack_1b54 = local_398._4_4_ * local_1b48._4_4_;
        fStack_1b50 = (float)uStack_390 * (float)uStack_1b40;
        fStack_1b4c = uStack_390._4_4_ * uStack_1b40._4_4_;
        local_1c78 = CONCAT44(fStack_1b54 + fVar40,local_1b58 + fVar39);
        uStack_1c70 = CONCAT44(fStack_1b4c + fStack_1adc + in_stack_ffffffffffffd444,
                               fStack_1b50 + fVar41);
        local_1c60 = local_1f48;
        *(undefined8 *)local_1f48 = local_1c78;
        *(undefined8 *)(local_1f48 + 2) = uStack_1c70;
        local_1f98 = local_1f98 + 8;
        local_1fa0 = local_1fa0 + 8;
        local_1fa8 = local_1fa8 + 8;
        local_1f48 = local_1f48 + 4;
        local_1b78 = uVar17;
        uStack_1b70 = uVar18;
        local_1b68 = local_1b98;
        uStack_1b60 = uStack_1b90;
        local_1b48 = local_1b88;
        uStack_1b40 = uStack_1b80;
        local_1b38 = uVar17;
        uStack_1b30 = uVar18;
        local_1b08 = uVar15;
        uStack_1b00 = uVar16;
        local_1af8 = local_1b28;
        uStack_1af0 = uStack_1b20;
        local_1ad8 = local_1b18;
        uStack_1ad0 = uStack_1b10;
        local_1ac8 = uVar15;
        uStack_1ac0 = uVar16;
        local_1a98 = uVar13;
        uStack_1a90 = uVar14;
        local_1a88 = local_1ab8;
        uStack_1a80 = uStack_1ab0;
        local_1a68 = local_1aa8;
        uStack_1a60 = uStack_1aa0;
        local_1a58 = uVar13;
        uStack_1a50 = uVar14;
        local_1a28 = uVar11;
        uStack_1a20 = uVar12;
        local_1a18 = local_1a48;
        uStack_1a10 = uStack_1a40;
        local_19f8 = local_1a38;
        uStack_19f0 = uStack_1a30;
        local_19e8 = uVar11;
        uStack_19e0 = uVar12;
        local_19b8 = uVar9;
        uStack_19b0 = uVar10;
        local_19a8 = local_19d8;
        uStack_19a0 = uStack_19d0;
        local_1988 = local_19c8;
        uStack_1980 = uStack_19c0;
        local_1978 = uVar9;
        uStack_1970 = uVar10;
        local_1948 = uVar7;
        uStack_1940 = uVar8;
        local_1938 = local_1968;
        uStack_1930 = uStack_1960;
        local_1918 = local_1958;
        uStack_1910 = uStack_1950;
        local_1908 = uVar7;
        uStack_1900 = uVar8;
        local_18d8 = uVar5;
        uStack_18d0 = uVar6;
        local_18c8 = local_18f8;
        uStack_18c0 = uStack_18f0;
        local_18a8 = local_18e8;
        uStack_18a0 = uStack_18e0;
        local_1898 = uVar5;
        uStack_1890 = uVar6;
        local_1868 = uVar3;
        uStack_1860 = uVar4;
        local_1858 = local_1888;
        uStack_1850 = uStack_1880;
        local_1838 = local_1878;
        uStack_1830 = uStack_1870;
        local_1828 = uVar3;
        uStack_1820 = uVar4;
        local_17f8 = uVar1;
        uStack_17f0 = uVar2;
        local_17c8 = local_1808;
        uStack_17c0 = uStack_1800;
        local_17b8 = uVar1;
        uStack_17b0 = uVar2;
      }
      local_1f98 = local_1f98 + local_1eb4;
      local_1fa0 = local_1fa0 + local_1eb4;
      local_1fa8 = local_1fa8 + local_1eb4;
      local_398 = uVar19;
      uStack_390 = uVar20;
      local_328 = uVar21;
      uStack_320 = uVar22;
      local_2b8 = uVar23;
      uStack_2b0 = uVar24;
      local_248 = uVar25;
      uStack_240 = uVar26;
      local_1d8 = uVar27;
      uStack_1d0 = uVar28;
      local_168 = uVar29;
      uStack_160 = uVar30;
      local_f8 = uVar31;
      uStack_f0 = uVar32;
      local_88 = uVar33;
      uStack_80 = uVar34;
      local_48 = uVar35;
      uStack_40 = uVar36;
      local_18 = uVar37;
      uStack_10 = uVar38;
    }
    Mat::~Mat((Mat *)0x627f37);
    Mat::~Mat((Mat *)0x627f44);
  }
  return;
}

Assistant:

static void convdw3x3s2_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 4;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + g * 4) : _mm_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m128 _k00 = _mm_loadu_ps(k0);
        __m128 _k01 = _mm_loadu_ps(k0 + 4);
        __m128 _k02 = _mm_loadu_ps(k0 + 8);
        __m128 _k10 = _mm_loadu_ps(k0 + 12);
        __m128 _k11 = _mm_loadu_ps(k0 + 16);
        __m128 _k12 = _mm_loadu_ps(k0 + 20);
        __m128 _k20 = _mm_loadu_ps(k0 + 24);
        __m128 _k21 = _mm_loadu_ps(k0 + 28);
        __m128 _k22 = _mm_loadu_ps(k0 + 32);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                __m128 _r04 = _mm_loadu_ps(r0 + 16);
                __m128 _r14 = _mm_loadu_ps(r1 + 16);
                __m128 _r24 = _mm_loadu_ps(r2 + 16);
                _mm_storeu_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r24, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r05 = _mm_loadu_ps(r0 + 20);
                __m128 _r15 = _mm_loadu_ps(r1 + 20);
                __m128 _r25 = _mm_loadu_ps(r2 + 20);
                __m128 _r06 = _mm_loadu_ps(r0 + 24);
                __m128 _r16 = _mm_loadu_ps(r1 + 24);
                __m128 _r26 = _mm_loadu_ps(r2 + 24);
                _mm_storeu_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r05, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r06, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r15, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r16, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r24, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r25, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r26, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r07 = _mm_loadu_ps(r0 + 28);
                __m128 _r17 = _mm_loadu_ps(r1 + 28);
                __m128 _r27 = _mm_loadu_ps(r2 + 28);
                __m128 _r08 = _mm_loadu_ps(r0 + 32);
                __m128 _r18 = _mm_loadu_ps(r1 + 32);
                __m128 _r28 = _mm_loadu_ps(r2 + 32);
                _mm_storeu_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r06, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r07, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r08, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r16, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r17, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r18, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r26, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r27, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r28, _sum3);

                _mm_storeu_ps(outptr0 + 12, _sum3);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                __m128 _r04 = _mm_loadu_ps(r0 + 16);
                __m128 _r14 = _mm_loadu_ps(r1 + 16);
                __m128 _r24 = _mm_loadu_ps(r2 + 16);
                _mm_storeu_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r24, _sum1);

                _mm_storeu_ps(outptr0 + 4, _sum1);

                r0 += 2 * 8;
                r1 += 2 * 8;
                r2 += 2 * 8;
                outptr0 += 8;
            }
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _mm_storeu_ps(outptr0, _sum0);
                r0 += 2 * 4;
                r1 += 2 * 4;
                r2 += 2 * 4;
                outptr0 += 4;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}